

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

void __thiscall
asio::detail::posix_event::wait<asio::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  bool bVar1;
  pthread_mutex_t *__mutex;
  scoped_lock *lock_local;
  posix_event *this_local;
  
  bVar1 = conditionally_enabled_mutex::scoped_lock::locked(lock);
  if (bVar1) {
    while ((this->state_ & 1) == 0) {
      this->state_ = this->state_ + 2;
      __mutex = (pthread_mutex_t *)conditionally_enabled_mutex::scoped_lock::mutex(lock);
      pthread_cond_wait((pthread_cond_t *)this,__mutex);
      this->state_ = this->state_ - 2;
    }
    return;
  }
  __assert_fail("lock.locked()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Swung0x48[P]SimpleRealTimeNetworking/includes/asio/asio/include/asio/detail/posix_event.hpp"
                ,0x72,
                "void asio::detail::posix_event::wait(Lock &) [Lock = asio::detail::conditionally_enabled_mutex::scoped_lock]"
               );
}

Assistant:

void wait(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    while ((state_ & 1) == 0)
    {
      state_ += 2;
      ::pthread_cond_wait(&cond_, &lock.mutex().mutex_); // Ignore EINVAL.
      state_ -= 2;
    }
  }